

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void convolutional_decode_warmup(correct_convolutional *conv,uint sets,uint8_t *soft)

{
  distance_t *pdVar1;
  distance_t *pdVar2;
  ulong uVar3;
  byte bVar4;
  distance_t dVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  size_t j;
  ulong uVar14;
  ulong local_50;
  uint local_44;
  
  if ((sets != 0) && (conv->order != 1)) {
    local_50 = 0;
    do {
      if (soft == (uint8_t *)0x0) {
        bVar4 = bit_reader_read(conv->bit_reader,(uint)conv->rate);
        local_44 = (uint)bVar4;
      }
      uVar7 = local_50 + 1;
      pdVar1 = conv->errors->read_errors;
      pdVar2 = conv->errors->write_errors;
      uVar14 = 0;
      do {
        if (soft == (uint8_t *)0x0) {
          uVar8 = conv->table[uVar14] ^ local_44;
          uVar8 = uVar8 - (uVar8 >> 1 & 0x55555555);
          uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
          dVar5 = (distance_t)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18);
        }
        else if (conv->soft_measurement == CORRECT_SOFT_LINEAR) {
          uVar3 = conv->rate;
          if (uVar3 == 0) {
            dVar5 = 0;
          }
          else {
            uVar8 = conv->table[uVar14];
            uVar9 = 1;
            uVar11 = 0;
            iVar6 = 0;
            do {
              uVar12 = uVar8 & 1;
              uVar8 = uVar8 >> 1;
              iVar10 = (uint)soft[uVar11 + uVar3 * local_50] + (-uVar12 & 0xffffff01);
              iVar13 = -iVar10;
              if (0 < iVar10) {
                iVar13 = iVar10;
              }
              iVar6 = iVar6 + iVar13;
              dVar5 = (distance_t)iVar6;
              uVar11 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar11 < uVar3);
          }
        }
        else {
          dVar5 = metric_soft_distance_quadratic
                            (conv->table[uVar14],soft + conv->rate * local_50,conv->rate);
        }
        pdVar2[uVar14] = dVar5 + pdVar1[uVar14 >> 1 & 0xffffffff];
        uVar14 = uVar14 + 1;
      } while (uVar14 != (long)(1 << ((byte)uVar7 & 0x1f)));
      error_buffer_swap(conv->errors);
    } while ((uVar7 < sets) && (local_50 = uVar7, uVar7 < conv->order - 1));
  }
  return;
}

Assistant:

void convolutional_decode_warmup(correct_convolutional *conv, unsigned int sets,
                                 const uint8_t *soft) {
    // first phase: load shiftregister up from 0 (order goes from 1 to conv->order)
    // we are building up error metrics for the first order bits
    for (unsigned int i = 0; i < conv->order - 1 && i < sets; i++) {
        // peel off rate bits from encoded to recover the same `out` as in the encoding process
        // the difference being that this `out` will have the channel noise/errors applied
        unsigned int out;
        if (!soft) {
            out = bit_reader_read(conv->bit_reader, conv->rate);
        }
        const distance_t *read_errors = conv->errors->read_errors;
        distance_t *write_errors = conv->errors->write_errors;
        // walk all of the state we have so far
        for (size_t j = 0; j < (1 << (i + 1)); j += 1) {
            unsigned int last = j >> 1;
            distance_t dist;
            if (soft) {
                if (conv->soft_measurement == CORRECT_SOFT_LINEAR) {
                    dist = metric_soft_distance_linear(conv->table[j], soft + i * conv->rate,
                                                       conv->rate);
                } else {
                    dist = metric_soft_distance_quadratic(conv->table[j], soft + i * conv->rate,
                                                          conv->rate);
                }
            } else {
                dist = metric_distance(conv->table[j], out);
            }
            write_errors[j] = dist + read_errors[last];
        }
        error_buffer_swap(conv->errors);
    }
}